

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddCorr.c
# Opt level: O1

double bddCorrelationAux(DdManager *dd,DdNode *f,DdNode *g,st__table *table)

{
  DdNode *pDVar1;
  anon_union_16_2_50f58667_for_type *paVar2;
  int iVar3;
  uint uVar4;
  double *key;
  double *value;
  uint uVar5;
  DdNode *pDVar6;
  DdNode *g_00;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *f_00;
  double dVar10;
  double dVar11;
  double *dummy;
  double *local_38;
  
  if (f == g) {
    return 1.0;
  }
  if ((DdNode *)((ulong)g ^ 1) == f) {
    return 0.0;
  }
  pDVar8 = f;
  if ((long)((ulong)((uint)g & 1) + *(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2) <
      (long)((ulong)((uint)f & 1) + *(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2)) {
    pDVar8 = g;
    g = f;
  }
  pDVar7 = (DdNode *)((ulong)pDVar8 & 0xfffffffffffffffe);
  pDVar1 = (DdNode *)((ulong)g ^ 1);
  if (((ulong)pDVar8 & 1) == 0) {
    pDVar7 = pDVar8;
    pDVar1 = g;
  }
  key = (double *)malloc(0x10);
  if (key == (double *)0x0) {
LAB_007c119c:
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    *key = (double)pDVar7;
    key[1] = (double)pDVar1;
    iVar3 = st__lookup(table,(char *)key,(char **)&local_38);
    if (iVar3 != 0) {
      dVar10 = *local_38;
      free(key);
      return dVar10;
    }
    pDVar8 = (DdNode *)((ulong)pDVar1 & 0xfffffffffffffffe);
    uVar4 = 0x7fffffff;
    uVar5 = 0x7fffffff;
    if ((ulong)pDVar7->index != 0x7fffffff) {
      uVar5 = dd->perm[pDVar7->index];
    }
    if ((ulong)pDVar8->index != 0x7fffffff) {
      uVar4 = dd->perm[pDVar8->index];
    }
    f_00 = pDVar7;
    if (uVar5 <= uVar4) {
      paVar2 = &pDVar7->type;
      pDVar7 = (pDVar7->type).kids.T;
      f_00 = (paVar2->kids).E;
    }
    pDVar6 = pDVar8;
    pDVar9 = pDVar8;
    if (uVar4 <= uVar5) {
      pDVar9 = (pDVar8->type).kids.T;
      pDVar6 = (pDVar8->type).kids.E;
    }
    g_00 = (DdNode *)((ulong)pDVar9 ^ 1);
    if (pDVar1 == pDVar8) {
      g_00 = pDVar9;
    }
    dVar10 = bddCorrelationAux(dd,pDVar7,g_00,table);
    dVar10 = dVar10 * 0.5;
    if ((dVar10 != -1.0) || (NAN(dVar10))) {
      pDVar7 = (DdNode *)((ulong)pDVar6 ^ 1);
      if (pDVar1 == pDVar8) {
        pDVar7 = pDVar6;
      }
      dVar11 = bddCorrelationAux(dd,f_00,pDVar7,table);
      dVar11 = dVar11 * 0.5;
      if ((dVar11 != -1.0) || (NAN(dVar11))) {
        value = (double *)malloc(8);
        if (value == (double *)0x0) goto LAB_007c119c;
        *value = dVar10 + dVar11;
        iVar3 = st__insert(table,(char *)key,(char *)value);
        if (iVar3 != -10000) {
          return dVar10 + dVar11;
        }
        free(key);
        key = value;
      }
    }
    free(key);
  }
  return -1.0;
}

Assistant:

static double
bddCorrelationAux(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  st__table * table)
{
    DdNode      *Fv, *Fnv, *G, *Gv, *Gnv;
    double      min, *pmin, min1, min2, *dummy;
    HashEntry   *entry;
    unsigned int topF, topG;

    statLine(dd);
#ifdef CORREL_STATS
    num_calls++;
#endif

    /* Terminal cases: only work for BDDs. */
    if (f == g) return(1.0);
    if (f == Cudd_Not(g)) return(0.0);

    /* Standardize call using the following properties:
    **     (f EXNOR g)   = (g EXNOR f)
    **     (f' EXNOR g') = (f EXNOR g).
    */
    if (cuddF2L(f) > cuddF2L(g)) {
        DdNode *tmp = f;
        f = g; g = tmp;
    }
    if (Cudd_IsComplement(f)) {
        f = Cudd_Not(f);
        g = Cudd_Not(g);
    }
    /* From now on, f is regular. */
    
    entry = ABC_ALLOC(HashEntry,1);
    if (entry == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    entry->f = f; entry->g = g;

    /* We do not use the fact that
    ** correlation(f,g') = 1 - correlation(f,g)
    ** to minimize the risk of cancellation.
    */
    if ( st__lookup(table, (const char *)entry, (char **)&dummy)) {
        min = *dummy;
        ABC_FREE(entry);
        return(min);
    }

    G = Cudd_Regular(g);
    topF = cuddI(dd,f->index); topG = cuddI(dd,G->index);
    if (topF <= topG) { Fv = cuddT(f); Fnv = cuddE(f); } else { Fv = Fnv = f; }
    if (topG <= topF) { Gv = cuddT(G); Gnv = cuddE(G); } else { Gv = Gnv = G; }

    if (g != G) {
        Gv = Cudd_Not(Gv);
        Gnv = Cudd_Not(Gnv);
    }

    min1 = bddCorrelationAux(dd, Fv, Gv, table) / 2.0;
    if (min1 == (double)CUDD_OUT_OF_MEM) {
        ABC_FREE(entry);
        return(CUDD_OUT_OF_MEM);
    }
    min2 = bddCorrelationAux(dd, Fnv, Gnv, table) / 2.0; 
    if (min2 == (double)CUDD_OUT_OF_MEM) {
        ABC_FREE(entry);
        return(CUDD_OUT_OF_MEM);
    }
    min = (min1+min2);
    
    pmin = ABC_ALLOC(double,1);
    if (pmin == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return((double)CUDD_OUT_OF_MEM);
    }
    *pmin = min;

    if ( st__insert(table,(char *)entry, (char *)pmin) == st__OUT_OF_MEM) {
        ABC_FREE(entry);
        ABC_FREE(pmin);
        return((double)CUDD_OUT_OF_MEM);
    }
    return(min);

}